

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable.hpp
# Opt level: O0

void __thiscall tmf::empty_callable::empty_callable(empty_callable *this,string *what)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *what_local;
  empty_callable *this_local;
  
  local_18 = what;
  what_local = (string *)this;
  std::operator+(&local_38,"[empty_callable]: ",what);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__empty_callable_00118d58;
  return;
}

Assistant:

empty_callable(const std::string& what)
    : std::runtime_error("[empty_callable]: " + what)
  {}